

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCompute
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmServerRequest *this_00;
  Value local_e0;
  allocator local_b1;
  string local_b0;
  int local_8c;
  cmake *pcStack_88;
  int ret;
  cmake *cm;
  string local_78;
  allocator local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if ((int)this->m_State < 3) {
    if ((int)this->m_State < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,"This project was not configured yet.",
                 (allocator *)((long)&cm + 7));
      cmServerRequest::ReportError(__return_storage_ptr__,request,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cm + 7));
    }
    else {
      pcStack_88 = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
      local_8c = cmake::Generate(pcStack_88);
      this_00 = local_20;
      if (local_8c < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b0,"Failed to compute build system.",&local_b1);
        cmServerRequest::ReportError(__return_storage_ptr__,this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
      else {
        this->m_State = STATE_COMPUTED;
        Json::Value::Value(&local_e0,nullValue);
        cmServerRequest::Reply(__return_storage_ptr__,this_00,&local_e0);
        Json::Value::~Value(&local_e0);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"This build system was already generated.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCompute(
  const cmServerRequest& request)
{
  if (this->m_State > STATE_CONFIGURED) {
    return request.ReportError("This build system was already generated.");
  }
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This project was not configured yet.");
  }

  cmake* cm = this->CMakeInstance();
  int ret = cm->Generate();

  if (ret < 0) {
    return request.ReportError("Failed to compute build system.");
  }
  m_State = STATE_COMPUTED;
  return request.Reply(Json::Value());
}